

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O1

void Abc_NtkComputeFanoutInfo(Abc_Obj_t *pObj,float Slew)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pAVar3;
  void *pvVar4;
  uint iFanin;
  long lVar5;
  long lVar6;
  char *__function;
  long lVar7;
  char *__file;
  long lVar8;
  float fVar9;
  
  if (0 < (pObj->vFanouts).nSize) {
    lVar8 = 0;
    do {
      pNode = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar8]];
      if ((((pNode->pNtk->ntkFunc == ABC_FUNC_MAP) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) &&
          ((pNode->vFanins).nSize == 1)) && ((pNode->field_5).pData == (void *)0x0)) {
        iVar1 = pNode->Id;
        lVar5 = (long)iVar1;
        if (lVar5 < 0) {
LAB_0045c640:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                        ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
        }
        pvVar4 = pNode->pNtk->pBSMan;
        if (*(int *)(*(long *)((long)pvVar4 + 0x50) + 4) <= iVar1) goto LAB_0045c640;
        if (*(int *)(*(long *)((long)pvVar4 + 0x40) + 4) <= iVar1) goto LAB_0045c602;
        *(undefined4 *)(*(long *)(*(long *)((long)pvVar4 + 0x40) + 8) + lVar5 * 4) =
             *(undefined4 *)(*(long *)(*(long *)((long)pvVar4 + 0x50) + 8) + lVar5 * 4);
        if (*(int *)(*(long *)((long)pvVar4 + 0x48) + 4) <= iVar1) goto LAB_0045c640;
        lVar6 = *(long *)((long)pvVar4 + 0x38);
        if (*(int *)(lVar6 + 4) <= iVar1) goto LAB_0045c602;
        fVar9 = *(float *)(*(long *)(*(long *)((long)pvVar4 + 0x48) + 8) + lVar5 * 4);
LAB_0045c56a:
        *(float *)(*(long *)(lVar6 + 8) + lVar5 * 4) = fVar9;
      }
      else if ((*(uint *)&pNode->field_0x14 & 0xf) - 5 < 0xfffffffe) {
        iFanin = Abc_NodeFindFanin(pNode,pObj);
        fVar9 = Abc_NtkComputeEdgeDept(pNode,iFanin,Slew);
        iVar1 = pNode->Id;
        lVar5 = (long)iVar1;
        if (-1 < lVar5) {
          pAVar3 = pNode->pNtk;
          pvVar4 = pAVar3->pBSMan;
          lVar7 = *(long *)((long)pvVar4 + 0x40);
          if (iVar1 < *(int *)(lVar7 + 4)) {
            *(float *)(*(long *)(lVar7 + 8) + lVar5 * 4) = fVar9;
            if (pAVar3->vGates->nSize <= iVar1) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar2 = pAVar3->vGates->pArray[lVar5];
            if ((ulong)uVar2 == 0xffffffff) {
              lVar7 = 0;
LAB_0045c51a:
              if ((-1 < (int)iFanin) && ((int)iFanin < *(int *)(lVar7 + 0x34))) {
                lVar6 = *(long *)((long)pvVar4 + 0x38);
                if (iVar1 < *(int *)(lVar6 + 4)) {
                  lVar7 = *(long *)(*(long *)(lVar7 + 0x38) + (ulong)iFanin * 8);
                  fVar9 = *(float *)(lVar7 + 0x10) * 0.5 + *(float *)(lVar7 + 0x14) * 0.5;
                  goto LAB_0045c56a;
                }
                goto LAB_0045c602;
              }
            }
            else if ((-1 < (int)uVar2) && ((int)uVar2 < *(int *)((long)pAVar3->pSCLib + 100))) {
              lVar7 = *(long *)(*(long *)((long)pAVar3->pSCLib + 0x68) + (ulong)uVar2 * 8);
              goto LAB_0045c51a;
            }
            __file = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
            ;
            __function = "void *Vec_PtrEntry(Vec_Ptr_t *, int)";
            goto LAB_0045c617;
          }
        }
LAB_0045c602:
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
        ;
        __function = "void Vec_FltWriteEntry(Vec_Flt_t *, int, float)";
LAB_0045c617:
        __assert_fail("i >= 0 && i < p->nSize",__file,0x184,__function);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (pObj->vFanouts).nSize);
  }
  return;
}

Assistant:

void Abc_NtkComputeFanoutInfo( Abc_Obj_t * pObj, float Slew )
{
    Abc_Obj_t * pFanout;
    int i;
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        if ( Abc_ObjIsBarBuf(pFanout) )
        {
            Bus_SclObjSetETime( pFanout, Bus_SclObjDept(pFanout) );
            Bus_SclObjSetCin( pFanout, Bus_SclObjLoad(pFanout) );
        }
        else if ( !Abc_ObjIsCo(pFanout) )
        {
            int iFanin = Abc_NodeFindFanin(pFanout, pObj);
            Bus_SclObjSetETime( pFanout, Abc_NtkComputeEdgeDept(pFanout, iFanin, Slew) );
            Bus_SclObjSetCin( pFanout, SC_CellPinCap( Abc_SclObjCell(pFanout), iFanin ) );
        }
    }
}